

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::removeEdge(Graph *this,int src_idx,int dst_idx)

{
  _Rb_tree_header *p_Var1;
  Node *pNVar2;
  Node *pNVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  iterator __position;
  iterator __position_00;
  
  pNVar2 = getNode(this,src_idx);
  pNVar3 = getNode(this,dst_idx);
  if (pNVar3 == (Node *)0x0 || pNVar2 == (Node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Index not found. Couldn\'t remove edge\n",0x26);
    return;
  }
  p_Var6 = (pNVar2->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(pNVar2->edges)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  __position._M_node = &p_Var1->_M_header;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      if (*(Node **)(p_Var6 + 1) >= pNVar3) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(Node **)(p_Var6 + 1) < pNVar3];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (__position._M_node = p_Var5, pNVar3 < *(Node **)(p_Var5 + 1))) {
      __position._M_node = &p_Var1->_M_header;
    }
  }
  p_Var6 = (pNVar3->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var4 = &(pNVar3->edges)._M_t._M_impl.super__Rb_tree_header;
    __position_00._M_node = &p_Var4->_M_header;
    do {
      if (*(Node **)(p_Var6 + 1) >= pNVar2) {
        __position_00._M_node = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(Node **)(p_Var6 + 1) < pNVar2];
    } while (p_Var6 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)__position_00._M_node != p_Var4) {
      if (pNVar2 < *(Node **)(__position_00._M_node + 1)) {
        __position_00._M_node = &p_Var4->_M_header;
      }
      if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
         ((_Rb_tree_header *)__position_00._M_node != p_Var4)) {
        std::
        _Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
        ::erase_abi_cxx11_((_Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
                            *)&pNVar2->edges,__position);
        std::
        _Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
        ::erase_abi_cxx11_((_Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
                            *)&pNVar3->edges,__position_00);
        return;
      }
    }
  }
  std::operator<<((ostream *)&std::cerr,"Index not found. Couldn\'t remove edge\n");
  exit(0);
}

Assistant:

void Graph::removeEdge(int src_idx, int dst_idx) {
    auto src_exist = getNode(src_idx);
    auto dst_exist = getNode(dst_idx);

    if(src_exist && dst_exist) {
        auto it1 = src_exist->edges.find(dst_exist);
        auto it2 = dst_exist->edges.find(src_exist);

        if(it1 != src_exist->edges.end() and
            it2 != dst_exist->edges.end()) {
            src_exist->edges.erase(it1);
            dst_exist->edges.erase(it2);
        } else {
            std::cerr << "Index not found. Couldn't remove edge\n";
            exit(0);
        }
    } else {
        std::cerr << "Index not found. Couldn't remove edge\n";
        //exit(0);
    }
}